

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::SampleMaskCase::init
          (SampleMaskCase *this,EVP_PKEY_CTX *ctx)

{
  TestLog *log;
  char *pcVar1;
  Context *pCVar2;
  RenderContext *renderCtx;
  _anonymous_namespace_ *this_00;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  size_type sVar7;
  int iVar8;
  deUint32 dVar9;
  ContextType type;
  GLSLVersion version;
  undefined4 uVar10;
  undefined4 extraout_var;
  RenderTarget *pRVar11;
  undefined4 extraout_var_00;
  char *__s;
  mapped_type *pmVar12;
  ShaderProgram *pSVar13;
  pointer pcVar14;
  undefined4 extraout_var_01;
  long *plVar15;
  TestError *pTVar16;
  NotSupportedError *pNVar17;
  int iVar18;
  size_type *psVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  undefined1 in_XMM4 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  size_type __dnew_1;
  GLint maxSamples;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  GLint maxSampleMaskWords;
  ScopedLogSection section;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridData;
  size_type __dnew_3;
  undefined1 local_2d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  int local_2ac;
  string local_2a8;
  undefined1 local_288 [8];
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_270;
  size_t local_260;
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  int local_22c;
  ShaderProgram *local_228;
  ScopedLogSection local_220;
  string local_218;
  undefined1 local_1f8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [6];
  ios_base local_188 [8];
  ios_base local_180 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_168;
  undefined1 local_148 [208];
  size_type local_78;
  string local_70;
  StringTemplate local_50;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar22 = CONCAT44(extraout_var,iVar8);
  local_2ac = 0;
  local_22c = 0;
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((pRVar11->m_width < this->m_maxSampleMaskWords) ||
     (pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context),
     pRVar11->m_height < this->m_maxSampleMaskWords)) {
    pNVar17 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>((string *)local_258,&this->m_maxSampleMaskWords);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8,
                   "render target size must be at least ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
    plVar15 = (long *)std::__cxx11::string::append(local_2d8);
    local_288 = (undefined1  [8])*plVar15;
    psVar19 = (size_type *)(plVar15 + 2);
    if (local_288 == (undefined1  [8])psVar19) {
      local_280._8_8_ = *psVar19;
      aStack_270._M_allocated_capacity = plVar15[3];
      local_288 = (undefined1  [8])(local_280 + 8);
    }
    else {
      local_280._8_8_ = *psVar19;
    }
    local_280._0_8_ = plVar15[1];
    *plVar15 = (long)psVar19;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    de::toString<int>(&local_2a8,&this->m_maxSampleMaskWords);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                   &local_2a8);
    tcu::NotSupportedError::NotSupportedError(pNVar17,(string *)local_1f8);
    __cxa_throw(pNVar17,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar22 + 0x868))(0x8e59,&local_22c);
  if (local_22c <
      *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4)) {
    pNVar17 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1f8 = (undefined1  [8])local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"Test requires larger GL_MAX_SAMPLE_MASK_WORDS","");
    tcu::NotSupportedError::NotSupportedError(pNVar17,(string *)local_1f8);
    __cxa_throw(pNVar17,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar22 + 0x868))(0x910e,&local_2ac);
  if (local_2ac < (int)this->m_verifierType) {
    pNVar17 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1f8 = (undefined1  [8])local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,
               "Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES","");
    tcu::NotSupportedError::NotSupportedError(pNVar17,(string *)local_1f8);
    __cxa_throw(pNVar17,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_1f8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f0,"GL_MAX_COLOR_TEXTURE_SAMPLES = ",0x1f);
  std::ostream::operator<<((ostringstream *)&local_1f0,local_2ac);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
  std::ios_base::~ios_base(local_180);
  if ((((ulong)this[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx & 4) != 0) &&
     ((this->m_verifierType & QUERY_POINTER) == QUERY_BOOLEAN)) {
    local_1f8 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f0,
               "Sample count is multiple of word size. No unused high bits in sample mask.\nSkipping."
               ,0x54);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
    std::ios_base::~ios_base(local_180);
    pNVar17 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1f8 = (undefined1  [8])local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,
               "Test requires unused high bits (sample count not multiple of 32)","");
    tcu::NotSupportedError::NotSupportedError(pNVar17,(string *)local_1f8);
    __cxa_throw(pNVar17,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_1f8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f0,"Creating multisample texture with sample count ",0x2f);
  std::ostream::operator<<((ostringstream *)&local_1f0,this->m_verifierType);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
  std::ios_base::~ios_base(local_180);
  (**(code **)(lVar22 + 0x6f8))
            (1,(undefined1 *)
               ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p
               + 4));
  (**(code **)(lVar22 + 0xb8))
            (0x9100,*(undefined4 *)
                     ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus
                             ._M_p + 4));
  (**(code **)(lVar22 + 0x1390))
            (0x9100,this->m_verifierType,0x8058,this->m_maxSampleMaskWords,
             this->m_maxSampleMaskWords,0);
  dVar9 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar9,"texStorage2DMultisample",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x28e);
  local_1f8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1f0,"Attaching texture to FBO",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f0);
  std::ios_base::~ios_base(local_180);
  (**(code **)(lVar22 + 0x6d0))
            (1,&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2);
  (**(code **)(lVar22 + 0x78))
            (0x8d40,*(undefined4 *)
                     &this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2);
  (**(code **)(lVar22 + 0x6a0))
            (0x8d40,0x8ce0,0x9100,
             *(undefined4 *)
              ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p +
              4),0);
  dVar9 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar9,"framebufferTexture2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x297);
  (**(code **)(lVar22 + 0x708))
            (1,&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length);
  dVar9 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar9,"genVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x29c);
  (**(code **)(lVar22 + 0x6c8))
            (1,(undefined1 *)
               ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length
               + 4));
  (**(code **)(lVar22 + 0x40))
            (0x8892,*(undefined4 *)
                     ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.
                             _M_string_length + 4));
  dVar9 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar9,"genBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x2a0);
  iVar8 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1f8,
             (long)(iVar8 * iVar8 * 6),(allocator_type *)local_288);
  iVar8 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
  if (0 < iVar8) {
    iVar18 = 0;
    do {
      if (0 < iVar8) {
        fVar24 = (float)iVar18;
        fVar25 = (float)(iVar18 + 1);
        iVar20 = 0;
        do {
          auVar28._0_4_ = (float)iVar8;
          auVar3._4_8_ = in_XMM4._8_8_;
          auVar3._0_4_ = fVar24;
          auVar35._0_8_ = auVar3._0_8_ << 0x20;
          auVar35._8_4_ = fVar24;
          auVar35._12_4_ = fVar24;
          auVar26._4_12_ = auVar35._4_12_;
          auVar26._0_4_ = (float)iVar20;
          auVar28._4_4_ = auVar28._0_4_;
          auVar28._8_4_ = auVar28._0_4_;
          auVar28._12_4_ = auVar28._0_4_;
          auVar34._4_4_ = fVar24;
          auVar34._0_4_ = auVar26._0_4_;
          auVar34._8_4_ = fVar24;
          auVar34._12_4_ = fVar24;
          auVar35 = divps(auVar34,auVar28);
          pcVar14 = (pointer)((long)local_1f8 + (long)((iVar8 * iVar18 + iVar20) * 6) * 0x10);
          *(ulong *)pcVar14 =
               CONCAT44(auVar35._4_4_ + auVar35._4_4_ + -1.0,auVar35._0_4_ + auVar35._0_4_ + -1.0);
          pcVar14[8] = '\0';
          pcVar14[9] = '\0';
          pcVar14[10] = '\0';
          pcVar14[0xb] = '\0';
          pcVar14[0xc] = '\0';
          pcVar14[0xd] = '\0';
          pcVar14[0xe] = -0x80;
          pcVar14[0xf] = '?';
          iVar8 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
          auVar29._0_4_ = (float)iVar8;
          auVar4._4_8_ = 0x3f80000000000000;
          auVar4._0_4_ = fVar25;
          auVar36._0_8_ = auVar4._0_8_ << 0x20;
          auVar36._8_4_ = fVar25;
          auVar36._12_4_ = fVar25;
          auVar37._4_12_ = auVar36._4_12_;
          auVar37._0_4_ = (float)iVar20;
          auVar29._4_4_ = auVar29._0_4_;
          auVar29._8_4_ = auVar29._0_4_;
          auVar29._12_4_ = auVar29._0_4_;
          auVar35 = divps(auVar37,auVar29);
          pcVar14 = (pointer)((long)local_1f8 + (long)((iVar8 * iVar18 + iVar20) * 6 + 1) * 0x10);
          *(ulong *)pcVar14 =
               CONCAT44(auVar35._4_4_ + auVar35._4_4_ + -1.0,auVar35._0_4_ + auVar35._0_4_ + -1.0);
          pcVar14[8] = '\0';
          pcVar14[9] = '\0';
          pcVar14[10] = '\0';
          pcVar14[0xb] = '\0';
          pcVar14[0xc] = '\0';
          pcVar14[0xd] = '\0';
          pcVar14[0xe] = -0x80;
          pcVar14[0xf] = '?';
          iVar8 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
          auVar38._0_4_ = (float)iVar8;
          iVar21 = iVar20 + 1;
          auVar5._4_8_ = auVar29._8_8_;
          auVar5._0_4_ = fVar25;
          auVar30._0_8_ = auVar5._0_8_ << 0x20;
          auVar30._8_4_ = fVar25;
          auVar30._12_4_ = fVar25;
          auVar31._4_12_ = auVar30._4_12_;
          auVar31._0_4_ = (float)iVar21;
          auVar38._4_4_ = auVar38._0_4_;
          auVar38._8_4_ = auVar38._0_4_;
          auVar38._12_4_ = auVar38._0_4_;
          auVar40._4_4_ = fVar25;
          auVar40._0_4_ = auVar31._0_4_;
          auVar40._8_4_ = fVar25;
          auVar40._12_4_ = fVar25;
          auVar35 = divps(auVar40,auVar38);
          pcVar14 = (pointer)((long)local_1f8 + (long)((iVar8 * iVar18 + iVar20) * 6 + 2) * 0x10);
          *(ulong *)pcVar14 =
               CONCAT44(auVar35._4_4_ + auVar35._4_4_ + -1.0,auVar35._0_4_ + auVar35._0_4_ + -1.0);
          pcVar14[8] = '\0';
          pcVar14[9] = '\0';
          pcVar14[10] = '\0';
          pcVar14[0xb] = '\0';
          pcVar14[0xc] = '\0';
          pcVar14[0xd] = '\0';
          pcVar14[0xe] = -0x80;
          pcVar14[0xf] = '?';
          iVar8 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
          auVar39._0_4_ = (float)iVar8;
          auVar39._4_4_ = auVar39._0_4_;
          auVar39._8_4_ = auVar39._0_4_;
          auVar39._12_4_ = auVar39._0_4_;
          auVar35 = divps(auVar26,auVar39);
          pcVar14 = (pointer)((long)local_1f8 + (long)((iVar8 * iVar18 + iVar20) * 6 + 3) * 0x10);
          *(ulong *)pcVar14 =
               CONCAT44(auVar35._4_4_ + auVar35._4_4_ + -1.0,auVar35._0_4_ + auVar35._0_4_ + -1.0);
          pcVar14[8] = '\0';
          pcVar14[9] = '\0';
          pcVar14[10] = '\0';
          pcVar14[0xb] = '\0';
          pcVar14[0xc] = '\0';
          pcVar14[0xd] = '\0';
          pcVar14[0xe] = -0x80;
          pcVar14[0xf] = '?';
          iVar8 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
          auVar27._0_4_ = (float)iVar8;
          auVar27._4_4_ = auVar27._0_4_;
          auVar27._8_4_ = auVar27._0_4_;
          auVar27._12_4_ = auVar27._0_4_;
          auVar35 = divps(auVar31,auVar27);
          pcVar14 = (pointer)((long)local_1f8 + (long)((iVar8 * iVar18 + iVar20) * 6 + 4) * 0x10);
          *(ulong *)pcVar14 =
               CONCAT44(auVar35._4_4_ + auVar35._4_4_ + -1.0,auVar35._0_4_ + auVar35._0_4_ + -1.0);
          pcVar14[8] = '\0';
          pcVar14[9] = '\0';
          pcVar14[10] = '\0';
          pcVar14[0xb] = '\0';
          pcVar14[0xc] = '\0';
          pcVar14[0xd] = '\0';
          pcVar14[0xe] = -0x80;
          pcVar14[0xf] = '?';
          iVar8 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
          in_XMM4._0_4_ = (float)iVar8;
          auVar6._4_8_ = 0x3f80000000000000;
          auVar6._0_4_ = fVar24;
          auVar32._0_8_ = auVar6._0_8_ << 0x20;
          auVar32._8_4_ = fVar24;
          auVar32._12_4_ = fVar24;
          auVar33._4_12_ = auVar32._4_12_;
          auVar33._0_4_ = (float)iVar21;
          in_XMM4._4_4_ = in_XMM4._0_4_;
          in_XMM4._8_4_ = in_XMM4._0_4_;
          in_XMM4._12_4_ = in_XMM4._0_4_;
          auVar35 = divps(auVar33,in_XMM4);
          pcVar14 = (pointer)((long)local_1f8 + (long)((iVar8 * iVar18 + iVar20) * 6 + 5) * 0x10);
          *(ulong *)pcVar14 =
               CONCAT44(auVar35._4_4_ + auVar35._4_4_ + -1.0,auVar35._0_4_ + auVar35._0_4_ + -1.0);
          pcVar14[8] = '\0';
          pcVar14[9] = '\0';
          pcVar14[10] = '\0';
          pcVar14[0xb] = '\0';
          pcVar14[0xc] = '\0';
          pcVar14[0xd] = '\0';
          pcVar14[0xe] = -0x80;
          pcVar14[0xf] = '?';
          iVar8 = *(int *)&this[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode;
          iVar20 = iVar21;
        } while (iVar21 < iVar8);
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 < iVar8);
  }
  (**(code **)(lVar22 + 0x150))
            (0x8892,(long)((int)local_1f0 - local_1f8._0_4_) & 0xfffffffffffffff0,local_1f8,0x88e4);
  dVar9 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar9,"bufferData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x2b2);
  if (local_1f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1f8,local_1e8[0]._M_allocated_capacity - (long)local_1f8);
  }
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_288 = (undefined1  [8])0x15;
  local_1f8 = (undefined1  [8])local_1e8;
  local_1f8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_1f8,(ulong)local_288);
  local_1e8[0]._M_allocated_capacity = local_288;
  *(undefined8 *)local_1f8 = 0x65746172656e6547;
  builtin_strncpy((char *)((long)local_1f8 + 8),"SamplerS",8);
  builtin_strncpy((char *)((long)local_1f8 + 0xd),"erShader",8);
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288;
  *(char *)((long)local_1f8 + (long)local_288) = '\0';
  local_2d8._0_8_ = (pointer)0x17;
  local_288 = (undefined1  [8])(local_280 + 8);
  local_288 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_288,(ulong)local_2d8);
  local_280._8_8_ = local_2d8._0_8_;
  builtin_strncpy((char *)local_288,"Generate sampler shader",0x17);
  local_280._0_8_ = local_2d8._0_8_;
  *(char *)((long)local_288 + local_2d8._0_8_) = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&local_220,log,(string *)local_1f8,(string *)local_288);
  if (local_288 != (undefined1  [8])(local_280 + 8)) {
    operator_delete((void *)local_288,(ulong)(local_280._8_8_ + 1));
  }
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,(ulong)(local_1e8[0]._M_allocated_capacity + 1));
  }
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar22 = CONCAT44(extraout_var_00,iVar8);
  aStack_270._M_allocated_capacity = (size_type)local_280;
  local_280._0_8_ = local_280._0_8_ & 0xffffffff00000000;
  local_280._8_8_ = 0;
  local_260 = 0;
  aStack_270._8_8_ = aStack_270._M_allocated_capacity;
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  __s = glu::getGLSLVersionDeclaration(version);
  local_2d8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x11;
  local_1f8 = (undefined1  [8])local_1e8;
  local_1f8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_1f8,(ulong)local_2d8);
  local_1e8[0]._M_allocated_capacity = local_2d8._0_8_;
  *(undefined8 *)local_1f8 = 0x5245565f4c534c47;
  builtin_strncpy((char *)((long)local_1f8 + 8),"SION_DEC",8);
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_1f8 + 0x10))->_M_local_buf[0] = 'L';
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._0_8_;
  *(char *)((long)local_1f8 + local_2d8._0_8_) = '\0';
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_288,(key_type *)local_1f8);
  pcVar1 = (char *)pmVar12->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar12,0,pcVar1,(ulong)__s);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,local_1e8[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::ostream::operator<<(local_1f8,this->m_verifierType);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  local_1e8[0]._M_allocated_capacity = (pointer)0x4c504d41534d554e;
  local_1e8[0]._8_2_ = 0x5345;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xa;
  local_1e8[0]._M_local_buf[10] = '\0';
  local_1f8 = (undefined1  [8])local_1e8;
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_288,(key_type *)local_1f8);
  std::__cxx11::string::operator=((string *)pmVar12,(string *)local_2d8);
  if (local_1f8 != (undefined1  [8])local_1e8) {
    operator_delete((void *)local_1f8,(ulong)(local_1e8[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ != &local_2c8) {
    operator_delete((void *)local_2d8._0_8_,local_2c8._M_allocated_capacity + 1);
  }
  pSVar13 = (ShaderProgram *)operator_new(0xd0);
  pCVar2 = (this->super_TestCase).m_context;
  renderCtx = pCVar2->m_renderCtx;
  memset(local_1f8,0,0xac);
  local_148._0_8_ = (pointer)0x0;
  local_148[8] = 0;
  local_148._9_7_ = 0;
  local_148[0x10] = 0;
  local_148._17_8_ = 0;
  local_228 = pSVar13;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a8,(_anonymous_namespace_ *)pCVar2->m_renderCtx,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,__s);
  local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffff00000000;
  local_2d8._8_8_ = local_2c8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2d8 + 8),local_2a8._M_dataplus._M_p,
             local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1f8 + (local_2d8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2d8 + 8));
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_78 = 0x27a;
  pcVar14 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_218,(ulong)&local_78);
  sVar7 = local_78;
  local_218.field_2._M_allocated_capacity = local_78;
  local_218._M_dataplus._M_p = pcVar14;
  memcpy(pcVar14,
         "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nuniform highp sampler2DMS u_sampler;\nuniform highp int u_sample;\nvoid main (void)\n{\n\thighp float correctCoverage = 0.0;\n\thighp float incorrectCoverage = 0.0;\n\thighp ivec2 texelPos = ivec2(int(floor(gl_FragCoord.x)), int(floor(gl_FragCoord.y)));\n\n\tfor (int sampleNdx = 0; sampleNdx < ${NUMSAMPLES}; ++sampleNdx)\n\t{\n\t\thighp float sampleColor = texelFetch(u_sampler, texelPos, sampleNdx).r;\n\t\tif (sampleNdx == u_sample)\n\t\t\tcorrectCoverage += sampleColor;\n\t\telse\n\t\t\tincorrectCoverage += sampleColor;\n\t}\n\tfragColor = vec4(correctCoverage, incorrectCoverage, 0.0, 1.0);\n}\n"
         ,0x27a);
  local_218._M_string_length = sVar7;
  pcVar14[sVar7] = '\0';
  tcu::StringTemplate::StringTemplate(&local_50,&local_218);
  tcu::StringTemplate::specialize
            (&local_70,&local_50,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_288);
  local_258._0_4_ = 1;
  local_258._8_8_ = local_248._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_258 + 8),local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  pSVar13 = local_228;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1f8 + (ulong)(uint)local_258._0_4_ * 0x18),(value_type *)(local_258 + 8));
  glu::ShaderProgram::ShaderProgram(pSVar13,renderCtx,(ProgramSources *)local_1f8);
  *(ShaderProgram **)
   ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) = pSVar13;
  if ((char *)local_258._8_8_ != local_248._M_local_buf + 8) {
    operator_delete((void *)local_258._8_8_,local_248._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_2d8._8_8_ != local_2c8._M_local_buf + 8) {
    operator_delete((void *)local_2d8._8_8_,local_2c8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_168);
  lVar23 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1f8 + lVar23));
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  *(ShaderProgram **)
                   ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8))
  ;
  lVar23 = *(long *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8)
  ;
  if (*(char *)(lVar23 + 0xc0) == '\0') {
    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
    local_1f8 = (undefined1  [8])local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"Could not create sampler program.","");
    tcu::TestError::TestError(pTVar16,(string *)local_1f8);
    __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar10 = (**(code **)(lVar22 + 0x780))(*(undefined4 *)(lVar23 + 0x98),"a_position");
  *(undefined4 *)
   &this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p = uVar10;
  uVar10 = (**(code **)(lVar22 + 0xb48))
                     (*(undefined4 *)
                       (*(long *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name
                                         .field_2 + 8) + 0x98),"u_sampler");
  *(undefined4 *)
   ((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p + 4)
       = uVar10;
  uVar10 = (**(code **)(lVar22 + 0xb48))
                     (*(undefined4 *)
                       (*(long *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_name
                                         .field_2 + 8) + 0x98));
  *(undefined4 *)
   &this[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_string_length = uVar10;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_288);
  tcu::TestLog::endSection(local_220.m_log);
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pSVar13 = (ShaderProgram *)operator_new(0xd0);
  this_00 = (_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx;
  memset(local_1f8,0,0xac);
  local_148._0_8_ = (pointer)0x0;
  local_148[8] = 0;
  local_148._9_7_ = 0;
  local_148[0x10] = 0;
  local_148._17_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_258,this_00,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp float v_alpha;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_alpha = (a_position.x * 0.5 + 0.5)*(a_position.y * 0.5 + 0.5);\n}\n"
             ,__s);
  local_288 = (undefined1  [8])((ulong)local_288 & 0xffffffff00000000);
  local_280._0_8_ = &aStack_270;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_280,CONCAT44(local_258._4_4_,local_258._0_4_),
             (char *)(local_258._8_8_ + CONCAT44(local_258._4_4_,local_258._0_4_)));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1f8 + ((ulong)local_288 & 0xffffffff) * 0x18),(value_type *)local_280);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a8,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nin mediump float v_alpha;\nvoid main (void)\n{\n\tfragColor = vec4(1.0, 1.0, 1.0, v_alpha);\n}\n"
             ,__s);
  local_2d8._0_4_ = 1;
  local_2d8._8_8_ = local_2c8._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_2d8 + 8),local_2a8._M_dataplus._M_p,
             local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1f8 + (local_2d8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_2d8 + 8));
  glu::ShaderProgram::ShaderProgram(pSVar13,(RenderContext *)this_00,(ProgramSources *)local_1f8);
  *(ShaderProgram **)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 =
       pSVar13;
  if ((char *)local_2d8._8_8_ != local_2c8._M_local_buf + 8) {
    operator_delete((void *)local_2d8._8_8_,local_2c8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._0_8_ != &aStack_270) {
    operator_delete((void *)local_280._0_8_,(ulong)(aStack_270._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_258._4_4_,local_258._0_4_) != &local_248) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_258._4_4_,local_258._0_4_),local_248._M_allocated_capacity + 1
                   );
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_168);
  lVar22 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1f8 + lVar22));
    lVar22 = lVar22 + -0x18;
  } while (lVar22 != -0x18);
  pSVar13 = (ShaderProgram *)
            this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2.
            _M_allocated_capacity;
  if ((pSVar13->m_program).m_info.linkOk == false) {
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,pSVar13)
    ;
    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
    local_1f8 = (undefined1  [8])local_1e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,"Could not create aplha program.","");
    tcu::TestError::TestError(pTVar16,(string *)local_1f8);
    __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar8 = (**(code **)(CONCAT44(extraout_var_01,iVar8) + 0x780))
                    ((pSVar13->m_program).m_program,"a_position");
  *(int *)((long)&this[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 + 8) =
       iVar8;
  return iVar8;
}

Assistant:

void SampleMaskCase::init (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	glw::GLint				maxSamples			= 0;
	glw::GLint				maxSampleMaskWords	= 0;

	// requirements

	if (m_context.getRenderTarget().getWidth() < m_canvasSize || m_context.getRenderTarget().getHeight() < m_canvasSize)
		throw tcu::NotSupportedError("render target size must be at least " + de::toString(m_canvasSize) + "x" + de::toString(m_canvasSize));

	gl.getIntegerv(GL_MAX_SAMPLE_MASK_WORDS, &maxSampleMaskWords);
	if (m_effectiveSampleMaskWordCount > maxSampleMaskWords)
		throw tcu::NotSupportedError("Test requires larger GL_MAX_SAMPLE_MASK_WORDS");

	gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &maxSamples);
	if (m_samples > maxSamples)
		throw tcu::NotSupportedError("Requested sample count is greater than GL_MAX_COLOR_TEXTURE_SAMPLES");

	m_testCtx.getLog() << tcu::TestLog::Message << "GL_MAX_COLOR_TEXTURE_SAMPLES = " << maxSamples << tcu::TestLog::EndMessage;

	// Don't even try to test high bits if there are none

	if ((m_flags & FLAGS_HIGH_BITS) && (m_samples % 32 == 0))
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Sample count is multiple of word size. No unused high bits in sample mask.\nSkipping." << tcu::TestLog::EndMessage;
		throw tcu::NotSupportedError("Test requires unused high bits (sample count not multiple of 32)");
	}

	// generate textures

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating multisample texture with sample count " << m_samples << tcu::TestLog::EndMessage;

	gl.genTextures				(1, &m_texID);
	gl.bindTexture				(GL_TEXTURE_2D_MULTISAMPLE, m_texID);
	gl.texStorage2DMultisample	(GL_TEXTURE_2D_MULTISAMPLE, m_samples, GL_RGBA8, m_canvasSize, m_canvasSize, GL_FALSE);
	GLU_EXPECT_NO_ERROR			(gl.getError(), "texStorage2DMultisample");

	// attach texture to fbo

	m_testCtx.getLog() << tcu::TestLog::Message << "Attaching texture to FBO" << tcu::TestLog::EndMessage;

	gl.genFramebuffers		(1, &m_fboID);
	gl.bindFramebuffer		(GL_FRAMEBUFFER, m_fboID);
	gl.framebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, m_texID, 0);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "framebufferTexture2D");

	// buffers

	gl.genVertexArrays		(1, &m_vaoID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "genVertexArrays");

	gl.genBuffers			(1, &m_vboID);
	gl.bindBuffer			(GL_ARRAY_BUFFER, m_vboID);
	GLU_EXPECT_NO_ERROR		(gl.getError(), "genBuffers");

	// generate grid pattern
	{
		std::vector<tcu::Vec4> gridData(m_gridsize*m_gridsize*6);

		for (int y = 0; y < m_gridsize; ++y)
		for (int x = 0; x < m_gridsize; ++x)
		{
			gridData[(y * m_gridsize + x)*6 + 0] = tcu::Vec4(((float)(x+0) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+0) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 1] = tcu::Vec4(((float)(x+0) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+1) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 2] = tcu::Vec4(((float)(x+1) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+1) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 3] = tcu::Vec4(((float)(x+0) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+0) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 4] = tcu::Vec4(((float)(x+1) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+1) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
			gridData[(y * m_gridsize + x)*6 + 5] = tcu::Vec4(((float)(x+1) / (float)m_gridsize) * 2.0f - 1.0f, ((float)(y+0) / (float)m_gridsize) * 2.0f - 1.0f, 0.0f, 1.0f);
		}

		gl.bufferData			(GL_ARRAY_BUFFER, (int)(gridData.size() * sizeof(tcu::Vec4)), gridData[0].getPtr(), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR		(gl.getError(), "bufferData");
	}

	// generate programs

	genSamplerProgram();
	genAlphaProgram();
}